

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O1

void __thiscall
UtestShell::assertEquals
          (UtestShell *this,bool failed,char *expected,char *actual,char *text,char *file,
          size_t line,TestTerminator *testTerminator)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleString local_c8;
  SimpleString local_b8;
  SimpleString local_a8;
  TestFailure local_98;
  TestResult *pTVar2;
  
  pTVar2 = testResult_;
  if (testResult_ == (TestResult *)0x0) {
    OutsideTestRunnerUTest::instance();
    iVar1 = (*OutsideTestRunnerUTest::instance::instance_.super_UtestShell._vptr_UtestShell[0x2a])
                      (&OutsideTestRunnerUTest::instance::instance_);
    pTVar2 = (TestResult *)CONCAT44(extraout_var,iVar1);
  }
  (*pTVar2->_vptr_TestResult[10])();
  if (failed) {
    SimpleString::SimpleString(&local_b8,expected);
    SimpleString::SimpleString(&local_c8,actual);
    SimpleString::SimpleString(&local_a8,text);
    CheckEqualFailure::CheckEqualFailure
              ((CheckEqualFailure *)&local_98,this,file,line,&local_b8,&local_c8,&local_a8);
    (*this->_vptr_UtestShell[0x27])(this,&local_98,testTerminator);
    TestFailure::~TestFailure(&local_98);
    SimpleString::~SimpleString(&local_a8);
    SimpleString::~SimpleString(&local_c8);
    SimpleString::~SimpleString(&local_b8);
  }
  return;
}

Assistant:

void UtestShell::assertEquals(bool failed, const char* expected, const char* actual, const char* text, const char* file, size_t line, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (failed)
        failWith(CheckEqualFailure(this, file, line, expected, actual, text), testTerminator);
}